

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detectionoutput_x86_avx2.cpp
# Opt level: O2

int __thiscall
ncnn::Yolov3DetectionOutput_x86_avx2::forward
          (Yolov3DetectionOutput_x86_avx2 *this,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  undefined4 uVar1;
  pointer pMVar2;
  void *pvVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [12];
  undefined1 auVar8 [12];
  long lVar9;
  int iVar10;
  uint *puVar11;
  long lVar12;
  _func_int *p_Var13;
  ulong uVar14;
  undefined4 *puVar15;
  ulong uVar16;
  ulong uVar17;
  float *pfVar18;
  int iVar19;
  ulong uVar20;
  long lVar21;
  uint uVar22;
  ulong uVar23;
  long lVar24;
  long lVar25;
  int i;
  Mat *pMVar26;
  ulong uVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  undefined4 extraout_XMM0_Db;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [32];
  undefined1 extraout_var [60];
  undefined1 auVar38 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [64];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [64];
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  bbox_rects;
  undefined8 local_218;
  float *local_1d8;
  float *local_1d0;
  float *local_1c8;
  float *local_1c0;
  vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
  all_box_bbox_rects;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  all_bbox_rects;
  vector<unsigned_long,_std::allocator<unsigned_long>_> picked;
  uint local_c8;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  
  all_bbox_rects.
  super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  all_bbox_rects.
  super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  all_bbox_rects.
  super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar20 = 0;
  do {
    if ((ulong)(((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_finish -
                (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_start) / 0x48) <= uVar20) {
      Yolov3DetectionOutput::qsort_descent_inplace
                ((Yolov3DetectionOutput *)
                 ((long)&this->_vptr_Yolov3DetectionOutput_x86_avx2 +
                 (long)this->_vptr_Yolov3DetectionOutput_x86_avx2[-3]),&all_bbox_rects);
      picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      Yolov3DetectionOutput::nms_sorted_bboxes
                ((Yolov3DetectionOutput *)
                 ((long)&this->_vptr_Yolov3DetectionOutput_x86_avx2 +
                 (long)this->_vptr_Yolov3DetectionOutput_x86_avx2[-3]),&all_bbox_rects,&picked,
                 *(float *)(&this->field_0xdc + (long)this->_vptr_Yolov3DetectionOutput_x86_avx2[-3]
                           ));
      bbox_rects.
      super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0.0;
      bbox_rects.
      super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ._M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
      bbox_rects.
      super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      bbox_rects.
      super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0.0;
      bbox_rects.
      super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      for (uVar20 = 0;
          uVar20 < (ulong)((long)picked.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)picked.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 3); uVar20 = uVar20 + 1
          ) {
        std::
        vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
        ::push_back(&bbox_rects,
                    all_bbox_rects.
                    super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                    ._M_impl.super__Vector_impl_data._M_start +
                    picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                    .super__Vector_impl_data._M_start[uVar20]);
      }
      uVar20 = ((long)bbox_rects.
                      super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               CONCAT44(bbox_rects.
                        super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                        ._M_impl.super__Vector_impl_data._M_start._4_4_,
                        bbox_rects.
                        super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                        ._M_impl.super__Vector_impl_data._M_start._0_4_)) / 0x1c;
      iVar19 = (int)uVar20;
      if (iVar19 == 0) {
        iVar10 = 0;
      }
      else {
        pMVar26 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        ncnn::Mat::create(pMVar26,6,iVar19,4,opt->blob_allocator);
        pvVar3 = pMVar26->data;
        iVar10 = -100;
        if ((pvVar3 != (void *)0x0) && ((long)pMVar26->c * pMVar26->cstep != 0)) {
          puVar15 = (undefined4 *)
                    CONCAT44(bbox_rects.
                             super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,
                             bbox_rects.
                             super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                             ._M_impl.super__Vector_impl_data._M_start._0_4_);
          iVar10 = 0;
          uVar20 = uVar20 & 0xffffffff;
          if (iVar19 < 1) {
            uVar20 = 0;
          }
          for (uVar17 = 0; uVar20 != uVar17; uVar17 = uVar17 + 1) {
            uVar1 = *puVar15;
            lVar21 = (long)pMVar26->w * uVar17 * pMVar26->elemsize;
            *(float *)((long)pvVar3 + lVar21) = (float)(puVar15[6] + 1);
            *(undefined4 *)((long)pvVar3 + lVar21 + 4) = uVar1;
            *(undefined4 *)((long)pvVar3 + lVar21 + 8) = puVar15[1];
            *(undefined4 *)((long)pvVar3 + lVar21 + 0xc) = puVar15[2];
            *(undefined4 *)((long)pvVar3 + lVar21 + 0x10) = puVar15[3];
            *(undefined4 *)((long)pvVar3 + lVar21 + 0x14) = puVar15[4];
            puVar15 = puVar15 + 7;
          }
        }
      }
      std::
      _Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ::~_Vector_base(&bbox_rects.
                       super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                     );
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
LAB_00282c7c:
      std::
      _Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ::~_Vector_base(&all_bbox_rects.
                       super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                     );
      return iVar10;
    }
    all_box_bbox_rects.
    super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    all_box_bbox_rects.
    super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    all_box_bbox_rects.
    super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::
    vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
    ::resize(&all_box_bbox_rects,
             (long)*(int *)(&this->field_0xd4 + (long)this->_vptr_Yolov3DetectionOutput_x86_avx2[-3]
                           ));
    pMVar2 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    p_Var13 = this->_vptr_Yolov3DetectionOutput_x86_avx2[-3];
    iVar19 = *(int *)(&this->field_0xd4 + (long)p_Var13);
    iVar10 = pMVar2[uVar20].c / iVar19;
    if (iVar10 != *(int *)(&this->field_0xd0 + (long)p_Var13) + 5) {
      std::
      vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ::~vector(&all_box_bbox_rects);
      iVar10 = -1;
      goto LAB_00282c7c;
    }
    pMVar26 = pMVar2 + uVar20;
    lVar21 = (long)iVar19;
    uVar17._0_4_ = pMVar26->w;
    uVar17._4_4_ = pMVar26->h;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = uVar17;
    auVar31 = vcvtdq2ps_avx(auVar31);
    fVar28 = *(float *)(*(long *)(&this->field_0x170 + (long)p_Var13) + uVar20 * 4);
    auVar38._0_4_ = fVar28 * auVar31._0_4_;
    auVar38._4_4_ = fVar28 * auVar31._4_4_;
    auVar38._8_4_ = fVar28 * auVar31._8_4_;
    auVar38._12_4_ = fVar28 * auVar31._12_4_;
    auVar38 = vroundps_avx(auVar38,0xb);
    uVar16 = 0;
    if (0 < (int)(undefined4)uVar17) {
      uVar16 = uVar17 & 0xffffffff;
    }
    uVar23 = uVar17 >> 0x20;
    if (uVar17._4_4_ == 0 || (long)uVar17 < 0) {
      uVar23 = 0;
    }
    auVar39._0_12_ = ZEXT412(0x3f000000) << 0x40;
    auVar39._12_4_ = 0x3f000000;
    auVar46._8_8_ = auVar39._8_8_;
    auVar46._0_8_ = auVar31._0_8_;
    auVar39 = vrcpps_avx(auVar46);
    auVar40._8_4_ = 0x3f800000;
    auVar40._0_8_ = 0x3f8000003f800000;
    auVar40._12_4_ = 0x3f800000;
    auVar40 = vfmsub213ps_fma(auVar39,auVar46,auVar40);
    auVar39 = vfnmadd132ps_fma(auVar40,auVar39,auVar39);
    for (lVar25 = 0; lVar25 < iVar19; lVar25 = lVar25 + 1) {
      iVar19 = (int)lVar25 * iVar10;
      uVar14 = *(ulong *)(*(long *)(&this->field_0xe0 + (long)p_Var13) +
                         (long)((int)*(float *)(*(long *)(&this->field_0x128 + (long)p_Var13) +
                                                lVar21 * uVar20 * 4 + lVar25 * 4) * 2) * 4);
      ncnn::Mat::channel((Mat *)&picked,pMVar26,iVar19);
      local_1c0 = (float *)picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                           _M_impl.super__Vector_impl_data._M_start;
      ncnn::Mat::~Mat((Mat *)&picked);
      ncnn::Mat::channel((Mat *)&picked,pMVar26,iVar19 + 1);
      local_1c8 = (float *)picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                           _M_impl.super__Vector_impl_data._M_start;
      ncnn::Mat::~Mat((Mat *)&picked);
      ncnn::Mat::channel((Mat *)&picked,pMVar26,iVar19 + 2);
      local_1d0 = (float *)picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                           _M_impl.super__Vector_impl_data._M_start;
      ncnn::Mat::~Mat((Mat *)&picked);
      ncnn::Mat::channel((Mat *)&picked,pMVar26,iVar19 + 3);
      local_1d8 = (float *)picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                           _M_impl.super__Vector_impl_data._M_start;
      ncnn::Mat::~Mat((Mat *)&picked);
      ncnn::Mat::channel((Mat *)&picked,pMVar26,iVar19 + 4);
      pfVar18 = (float *)picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start;
      ncnn::Mat::~Mat((Mat *)&picked);
      ncnn::Mat::channel_range
                ((Mat *)&picked,pMVar26,iVar19 + 5,
                 *(int *)(&this->field_0xd0 + (long)this->_vptr_Yolov3DetectionOutput_x86_avx2[-3]))
      ;
      auVar40 = vpinsrd_avx(ZEXT416(local_c8 * 4),local_c8 * 5,1);
      auVar40 = vpinsrd_avx(auVar40,local_c8 * 6,2);
      vpinsrd_avx(auVar40,local_c8 * 7,3);
      auVar40 = vpunpckldq_avx(ZEXT416(local_c8 * 2),ZEXT416(local_c8 * 3));
      auVar40 = vshufps_avx(ZEXT416(local_c8),auVar40,0x41);
      auVar45 = ZEXT1664(auVar40);
      auVar32._8_4_ = 0x3f800000;
      auVar32._0_8_ = 0x3f8000003f800000;
      auVar32._12_4_ = 0x3f800000;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar14;
      auVar40 = vunpcklpd_avx(auVar32,auVar4);
      lVar12 = 0;
      for (uVar14 = 0; uVar14 != uVar23; uVar14 = uVar14 + 1) {
        auVar33._0_4_ = (float)(int)uVar14;
        auVar33._4_4_ = auVar33._0_4_;
        auVar33._8_4_ = auVar33._0_4_;
        auVar33._12_4_ = auVar33._0_4_;
        auVar46 = vunpcklpd_avx(auVar33,auVar38);
        lVar24 = lVar12;
        for (uVar27 = 0; uVar27 != uVar16; uVar27 = uVar27 + 1) {
          lVar9 = uVar27 * 4 + uVar14 * (long)(int)(undefined4)uVar17 * 4;
          p_Var13 = this->_vptr_Yolov3DetectionOutput_x86_avx2[-3];
          auVar51 = ZEXT464(0xff7fffff);
          for (puVar11 = (uint *)((long)picked.
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar24);
              puVar11 < (uint *)((long)picked.
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_start +
                                (long)(int)((*(uint *)(&this->field_0xd0 + (long)p_Var13) &
                                            0xfffffff8) * local_c8) * 4 + lVar9);
              puVar11 = puVar11 + (int)(local_c8 * 8)) {
            auVar6 = vpcmpeqd_avx2(auVar45._0_32_,auVar45._0_32_);
            auVar37 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar6);
            auVar6 = vpermpd_avx2(auVar37,0x4e);
            auVar6 = vmaxps_avx(auVar37,auVar6);
            auVar5 = vshufpd_avx(auVar6,auVar6,5);
            auVar6 = vmaxps_avx(auVar6,auVar5);
            auVar5 = vshufps_avx(auVar6,auVar6,0xb1);
            auVar6 = vmaxps_avx(auVar6,auVar5);
            auVar45 = ZEXT3264(auVar6);
            if (auVar51._0_4_ < auVar6._0_4_) {
              auVar5 = vcmpps_avx(auVar37,auVar6,0);
              uVar22 = vmovmskps_avx(auVar5);
              iVar19 = 0;
              if (uVar22 != 0) {
                for (; (uVar22 >> iVar19 & 1) == 0; iVar19 = iVar19 + 1) {
                }
              }
              auVar51 = ZEXT1664(auVar6._0_16_);
            }
          }
          while( true ) {
            if ((uint *)((long)picked.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start +
                        (long)(int)(*(uint *)(&this->field_0xd0 + (long)p_Var13) * local_c8) * 4 +
                        lVar9) <= puVar11) break;
            auVar4 = vmaxss_avx(ZEXT416(*puVar11),auVar51._0_16_);
            auVar51 = ZEXT1664(auVar4);
            puVar11 = puVar11 + (int)local_c8;
          }
          fVar28 = expf(-*pfVar18);
          fVar29 = expf(-auVar51._0_4_);
          auVar45 = ZEXT464(0x3f800000);
          auVar4 = vfmadd132ss_fma(ZEXT416((uint)(fVar29 + 1.0)),auVar45._0_16_,
                                   ZEXT416((uint)fVar28));
          fVar28 = 1.0 / auVar4._0_4_;
          if (*(float *)(&this->field_0xd8 + (long)p_Var13) <= fVar28) {
            fVar29 = expf(-*local_1c0);
            fVar30 = expf(-*local_1c8);
            auVar4 = vinsertps_avx(ZEXT416((uint)(fVar29 + 1.0)),ZEXT416((uint)(fVar30 + 1.0)),0x10)
            ;
            fVar29 = expf(*local_1d0);
            local_218 = CONCAT44(extraout_XMM0_Db,fVar29);
            auVar45._0_4_ = expf(*local_1d8);
            auVar45._4_60_ = extraout_var;
            auVar32 = vrcpps_avx(auVar4);
            auVar47._0_4_ = auVar40._0_4_ * auVar32._0_4_;
            auVar47._4_4_ = auVar40._4_4_ * auVar32._4_4_;
            auVar47._8_4_ = auVar40._8_4_ * auVar32._8_4_;
            auVar47._12_4_ = auVar40._12_4_ * auVar32._12_4_;
            auVar4 = vfmsub213ps_fma(auVar4,auVar47,auVar40);
            auVar33 = vfnmadd213ps_fma(auVar4,auVar32,auVar47);
            auVar41._8_8_ = local_218;
            auVar41._0_8_ = local_218;
            auVar4 = vinsertps_avx(auVar41,auVar45._0_16_,0x30);
            auVar7._4_8_ = auVar4._8_8_;
            auVar7._0_4_ = auVar40._4_4_ * auVar4._4_4_;
            auVar34._0_8_ = auVar7._0_8_ << 0x20;
            auVar34._8_4_ = auVar40._8_4_ * auVar4._8_4_;
            auVar34._12_4_ = auVar40._12_4_ * auVar4._12_4_;
            auVar35._8_8_ = auVar34._8_8_;
            auVar35._0_8_ = auVar33._0_8_;
            auVar42._0_4_ = (float)(int)uVar27;
            auVar42._4_12_ = auVar46._4_12_;
            auVar4 = vrcpps_avx(auVar42);
            auVar50._0_4_ = auVar33._0_4_ * auVar4._0_4_;
            auVar50._4_4_ = auVar33._4_4_ * auVar4._4_4_;
            auVar50._8_4_ = auVar34._8_4_ * auVar4._8_4_;
            auVar50._12_4_ = auVar34._12_4_ * auVar4._12_4_;
            auVar32 = vfmsub231ps_fma(auVar35,auVar42,auVar50);
            auVar34 = vfnmadd213ps_fma(auVar32,auVar4,auVar50);
            local_a8 = auVar39._0_4_;
            fStack_a4 = auVar39._4_4_;
            fStack_a0 = auVar39._8_4_;
            fStack_9c = auVar39._12_4_;
            auVar43._0_4_ = (auVar33._0_4_ + auVar42._0_4_) * local_a8;
            auVar43._4_4_ = (auVar33._4_4_ + auVar46._4_4_) * fStack_a4;
            auVar43._8_4_ = (auVar33._8_4_ + auVar46._8_4_) * fStack_a0;
            auVar43._12_4_ = (auVar33._12_4_ + auVar46._12_4_) * fStack_9c;
            auVar48._0_4_ = auVar34._0_4_ * auVar31._0_4_;
            auVar48._4_4_ = auVar34._4_4_ * auVar31._4_4_;
            auVar48._8_4_ = auVar34._8_4_ * 0.5;
            auVar48._12_4_ = auVar34._12_4_ * 0.5;
            auVar4 = vshufpd_avx(auVar48,auVar43,1);
            auVar32 = vsubps_avx(auVar43,auVar4);
            auVar8._4_8_ = auVar48._8_8_;
            auVar8._0_4_ = auVar48._4_4_ + auVar4._4_4_;
            auVar49._0_8_ = auVar8._0_8_ << 0x20;
            auVar49._8_4_ = auVar48._8_4_ + auVar4._8_4_;
            auVar49._12_4_ = auVar48._12_4_ + auVar4._12_4_;
            auVar44._0_8_ = auVar32._0_8_;
            auVar44._8_8_ = auVar49._8_8_;
            auVar45 = ZEXT1664(auVar44);
            auVar4 = vmovshdup_avx(auVar34);
            auVar36._0_4_ = auVar4._0_4_ * auVar34._0_4_;
            auVar36._4_4_ = auVar4._4_4_ * auVar34._4_4_;
            auVar36._8_4_ = auVar4._8_4_ * auVar34._8_4_;
            auVar36._12_4_ = auVar4._12_4_ * auVar34._12_4_;
            bbox_rects.
            super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
            ._M_impl.super__Vector_impl_data._M_start._4_4_ = auVar32._0_4_;
            bbox_rects.
            super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
            ._M_impl.super__Vector_impl_data._M_finish = auVar44._4_8_;
            bbox_rects.
            super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = vextractps_avx(auVar36,2);
            bbox_rects.
            super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
            ._M_impl.super__Vector_impl_data._M_start._0_4_ = fVar28;
            bbox_rects.
            super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = auVar49._12_4_;
            std::
            vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
            ::push_back(all_box_bbox_rects.
                        super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar25,(value_type *)&bbox_rects
                       );
          }
          local_1c0 = local_1c0 + 1;
          local_1c8 = local_1c8 + 1;
          local_1d0 = local_1d0 + 1;
          local_1d8 = local_1d8 + 1;
          pfVar18 = pfVar18 + 1;
          lVar24 = lVar24 + 4;
        }
        lVar12 = lVar12 + (long)(int)(undefined4)uVar17 * 4;
      }
      ncnn::Mat::~Mat((Mat *)&picked);
      p_Var13 = this->_vptr_Yolov3DetectionOutput_x86_avx2[-3];
      iVar19 = *(int *)(&this->field_0xd4 + (long)p_Var13);
    }
    lVar21 = 8;
    for (lVar25 = 0; lVar25 < *(int *)(&this->field_0xd4 + (long)p_Var13); lVar25 = lVar25 + 1) {
      std::
      vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
      ::
      insert<__gnu_cxx::__normal_iterator<ncnn::Yolov3DetectionOutput::BBoxRect_const*,std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>>,void>
                ((vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                  *)&all_bbox_rects,
                 (const_iterator)
                 all_bbox_rects.
                 super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 *(BBoxRect **)
                  ((long)all_box_bbox_rects.
                         super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar21 + -8),
                 *(BBoxRect **)
                  ((long)&((all_box_bbox_rects.
                            super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                          )._M_impl.super__Vector_impl_data._M_start + lVar21));
      p_Var13 = this->_vptr_Yolov3DetectionOutput_x86_avx2[-3];
      lVar21 = lVar21 + 0x18;
    }
    std::
    vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
    ::~vector(&all_box_bbox_rects);
    uVar20 = uVar20 + 1;
  } while( true );
}

Assistant:

int Yolov3DetectionOutput_x86_avx2::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    // gather all box
    std::vector<BBoxRect> all_bbox_rects;

    for (size_t b = 0; b < bottom_blobs.size(); b++)
    {
        std::vector<std::vector<BBoxRect> > all_box_bbox_rects;
        all_box_bbox_rects.resize(num_box);
        const Mat& bottom_top_blobs = bottom_blobs[b];

        int w = bottom_top_blobs.w;
        int h = bottom_top_blobs.h;
        int channels = bottom_top_blobs.c;
        //printf("%d %d %d\n", w, h, channels);
        const int channels_per_box = channels / num_box;

        // anchor coord + box score + num_class
        if (channels_per_box != 4 + 1 + num_class)
            return -1;
        size_t mask_offset = b * num_box;
        int net_w = (int)(anchors_scale[b] * w);
        int net_h = (int)(anchors_scale[b] * h);
//printf("%d %d\n", net_w, net_h);

//printf("%d %d %d\n", w, h, channels);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < num_box; pp++)
        {
            int p = pp * channels_per_box;
            int biases_index = static_cast<int>(mask[pp + mask_offset]);
            //printf("%d\n", biases_index);
            const float bias_w = biases[biases_index * 2];
            const float bias_h = biases[biases_index * 2 + 1];
            //printf("%f %f\n", bias_w, bias_h);
            const float* xptr = bottom_top_blobs.channel(p);
            const float* yptr = bottom_top_blobs.channel(p + 1);
            const float* wptr = bottom_top_blobs.channel(p + 2);
            const float* hptr = bottom_top_blobs.channel(p + 3);

            const float* box_score_ptr = bottom_top_blobs.channel(p + 4);

            // softmax class scores
            Mat scores = bottom_top_blobs.channel_range(p + 5, num_class);
            //softmax->forward_inplace(scores, opt);

            const int cs = scores.cstep;

#if __AVX__
            const __m256i vi = _mm256_setr_epi32(
                                   0, cs * 1, cs * 2, cs * 3, cs * 4, cs * 5, cs * 6, cs * 7);
#endif

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
#if 0
                    int class_index = 0;
                    float class_score = -FLT_MAX;
                    for (int q = 0; q < num_class; q++)
                    {
                        float score = scores.channel(q).row(i)[j];
                        if (score > class_score)
                        {
                            class_index = q;
                            class_score = score;
                        }
                    }
#else
                    // find class index with max class score
                    int class_index = 0;
                    float class_score = -FLT_MAX;
                    float* ptr = ((float*)scores.data) + i * w + j;
                    float* end = ptr + num_class * cs;
                    int q = 0;
#if __AVX2__
                    float* end8 = ptr + (num_class & -8) * cs;
                    unsigned long index;

                    for (; ptr < end8; ptr += 8 * cs, q += 8)
                    {
                        __m256 p = _mm256_i32gather_ps(ptr, vi, 4);
                        __m256 t = _mm256_max_ps(p, _mm256_permute2f128_ps(p, p, 1));
                        t = _mm256_max_ps(t, _mm256_permute_ps(t, 0x4e));
                        t = _mm256_max_ps(t, _mm256_permute_ps(t, 0xb1));
                        float score = _mm_cvtss_f32(_mm256_extractf128_ps(t, 0));

                        if (score > class_score)
                        {
                            __m256 mi = _mm256_cmp_ps(p, t, _CMP_EQ_OQ);
                            int mask = _mm256_movemask_ps(mi);
#ifdef _MSC_VER
                            BitScanForward(&index, mask);
#else
                            index = __builtin_ctz(mask);
#endif
                            class_index = q + index;
                            class_score = score;
                        }
                    }
#endif

                    for (; ptr < end; ptr += cs, q++)
                    {
                        if (*ptr > class_score)
                        {
                            class_index = q;
                            class_score = *ptr;
                        }
                    }
#endif
                    //sigmoid(box_score) * sigmoid(class_score)
                    float confidence = 1.f / ((1.f + exp(-box_score_ptr[0]) * (1.f + exp(-class_score))));
                    if (confidence >= confidence_threshold)
                    {
                        // region box
                        float bbox_cx = (j + sigmoid(xptr[0])) / w;
                        float bbox_cy = (i + sigmoid(yptr[0])) / h;
                        float bbox_w = static_cast<float>(exp(wptr[0]) * bias_w / net_w);
                        float bbox_h = static_cast<float>(exp(hptr[0]) * bias_h / net_h);

                        float bbox_xmin = bbox_cx - bbox_w * 0.5f;
                        float bbox_ymin = bbox_cy - bbox_h * 0.5f;
                        float bbox_xmax = bbox_cx + bbox_w * 0.5f;
                        float bbox_ymax = bbox_cy + bbox_h * 0.5f;

                        float area = bbox_w * bbox_h;

                        BBoxRect c = {confidence, bbox_xmin, bbox_ymin, bbox_xmax, bbox_ymax, area, class_index};
                        all_box_bbox_rects[pp].push_back(c);
                    }

                    xptr++;
                    yptr++;
                    wptr++;
                    hptr++;

                    box_score_ptr++;
                }
            }
        }

        for (int i = 0; i < num_box; i++)
        {
            const std::vector<BBoxRect>& box_bbox_rects = all_box_bbox_rects[i];

            all_bbox_rects.insert(all_bbox_rects.end(), box_bbox_rects.begin(), box_bbox_rects.end());
        }
    }

    // global sort inplace
    qsort_descent_inplace(all_bbox_rects);

    // apply nms
    std::vector<size_t> picked;
    nms_sorted_bboxes(all_bbox_rects, picked, nms_threshold);

    // select
    std::vector<BBoxRect> bbox_rects;

    for (size_t i = 0; i < picked.size(); i++)
    {
        size_t z = picked[i];
        bbox_rects.push_back(all_bbox_rects[z]);
    }

    // fill result
    int num_detected = static_cast<int>(bbox_rects.size());
    if (num_detected == 0)
        return 0;

    Mat& top_blob = top_blobs[0];
    top_blob.create(6, num_detected, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    for (int i = 0; i < num_detected; i++)
    {
        const BBoxRect& r = bbox_rects[i];
        float score = r.score;
        float* outptr = top_blob.row(i);

        outptr[0] = static_cast<float>(r.label + 1); // +1 for prepend background class
        outptr[1] = score;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}